

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O2

uint lodepng_deflate(uchar **out,size_t *outsize,uchar *in,size_t insize,
                    LodePNGCompressSettings *settings)

{
  uint *puVar1;
  int iVar2;
  uint uVar3;
  size_t __size;
  uint *puVar4;
  uint *puVar5;
  uint uVar6;
  ulong uVar7;
  int *__ptr;
  int *__ptr_00;
  unsigned_short *__ptr_01;
  unsigned_short *__ptr_02;
  int *__ptr_03;
  long lVar8;
  uint *puVar9;
  ulong uVar10;
  size_t sVar11;
  uint extraout_EDX;
  uint value;
  uint extraout_EDX_00;
  size_t sVar12;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  ulong extraout_RDX_01;
  ulong extraout_RDX_02;
  ulong extraout_RDX_03;
  ulong extraout_RDX_04;
  ulong extraout_RDX_05;
  ulong extraout_RDX_06;
  uint uVar13;
  ulong uVar14;
  size_t sVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  uint *puVar19;
  ulong uVar20;
  bool bVar21;
  LodePNGBitWriter local_258;
  ulong local_248;
  uchar **local_240;
  unsigned_short *local_238;
  uint local_22c;
  HuffmanTree tree_ll;
  uivector bitlen_lld_e;
  uivector lz77_encoded;
  uivector local_198;
  HuffmanTree tree_d;
  uivector bitlen_lld;
  uivector frequencies_cl;
  uivector frequencies_d;
  uivector frequencies_ll;
  HuffmanTree tree_cl;
  ucvector v;
  Hash hash;
  
  v.data = *out;
  v.size = *outsize;
  local_258.data = &v;
  local_258.bp = 0;
  uVar13 = settings->btype;
  if (uVar13 < 3) {
    sVar15 = insize;
    local_240 = out;
    v.allocsize = v.size;
    if (uVar13 != 1) {
      if (uVar13 == 0) {
        uVar7 = (insize + 0xfffe) / 0xffff;
        uVar13 = 0;
        for (uVar16 = 0; uVar16 != uVar7; uVar16 = uVar16 + 1) {
          ucvector_push_back(&v,uVar16 == uVar7 - 1);
          iVar2 = (int)insize - uVar13;
          if (0xfffe < insize - uVar13) {
            iVar2 = 0xffff;
          }
          ucvector_push_back(&v,(uchar)iVar2);
          ucvector_push_back(&v,(uchar)((uint)iVar2 >> 8));
          ucvector_push_back(&v,(uchar)(0xffff - iVar2));
          ucvector_push_back(&v,(uchar)((uint)(0xffff - iVar2) >> 8));
          for (uVar18 = 0;
              (uVar18 < 0xffff && (uVar14 = (ulong)(uVar13 + (int)uVar18), uVar14 < insize));
              uVar18 = uVar18 + 1) {
            ucvector_push_back(&v,in[uVar14]);
          }
          uVar13 = uVar13 + (int)uVar18;
        }
        uVar13 = 0;
        out = local_240;
        goto LAB_0010fe25;
      }
      uVar7 = 0xfff8;
      if (0xfff8 < insize >> 3) {
        uVar7 = insize >> 3;
      }
      if (0x3fff7 < uVar7) {
        uVar7 = 0x3fff8;
      }
      sVar15 = uVar7 + 8;
    }
    uVar7 = 1;
    if (!CARRY8(insize - 1,sVar15)) {
      uVar7 = ((insize - 1) + sVar15) / sVar15;
    }
    uVar16 = (ulong)settings->windowsize;
    __ptr = (int *)malloc(0x40000);
    hash.head = __ptr;
    __ptr_00 = (int *)malloc(uVar16 * 4);
    __size = uVar16 * 2;
    hash.val = __ptr_00;
    __ptr_01 = (unsigned_short *)malloc(__size);
    hash.chain = __ptr_01;
    __ptr_02 = (unsigned_short *)malloc(__size);
    hash.zeros = __ptr_02;
    __ptr_03 = (int *)malloc(0x40c);
    hash.headz = __ptr_03;
    local_238 = (unsigned_short *)malloc(__size);
    uVar13 = 0x53;
    if (((((__ptr_00 != (int *)0x0) && (__ptr != (int *)0x0)) && (__ptr_01 != (unsigned_short *)0x0)
         ) && ((__ptr_02 != (unsigned_short *)0x0 && (__ptr_03 != (int *)0x0)))) &&
       (local_238 != (unsigned_short *)0x0)) {
      for (lVar8 = 0; lVar8 != 0x10000; lVar8 = lVar8 + 1) {
        __ptr[lVar8] = -1;
      }
      for (uVar18 = 0; uVar16 != uVar18; uVar18 = uVar18 + 1) {
        __ptr_00[uVar18] = -1;
      }
      for (uVar18 = 0; uVar16 != uVar18; uVar18 = uVar18 + 1) {
        __ptr_01[uVar18] = (unsigned_short)uVar18;
      }
      for (lVar8 = 0; lVar8 != 0x103; lVar8 = lVar8 + 1) {
        __ptr_03[lVar8] = -1;
      }
      for (uVar18 = 0; uVar16 != uVar18; uVar18 = uVar18 + 1) {
        local_238[uVar18] = (unsigned_short)uVar18;
      }
      uVar16 = 0;
      uVar13 = 0;
      hash.chainz = local_238;
LAB_0010f4a3:
      if ((uVar16 != uVar7) && (uVar13 == 0)) {
        uVar14 = uVar16 * sVar15;
        uVar18 = sVar15 + uVar14;
        if (insize <= sVar15 + uVar14) {
          uVar18 = insize;
        }
        uVar6 = (uint)(uVar16 == uVar7 - 1);
        if (settings->btype == 2) {
          lz77_encoded.data = (uint *)0x0;
          lz77_encoded.size = 0;
          lz77_encoded.allocsize = 0;
          tree_ll.codes = (uint *)0x0;
          tree_ll.lengths = (uint *)0x0;
          tree_ll.table_len = (uchar *)0x0;
          tree_ll.table_value = (unsigned_short *)0x0;
          tree_d.codes = (uint *)0x0;
          tree_d.lengths = (uint *)0x0;
          tree_d.table_len = (uchar *)0x0;
          tree_d.table_value = (unsigned_short *)0x0;
          tree_cl.codes = (uint *)0x0;
          tree_cl.lengths = (uint *)0x0;
          frequencies_ll.allocsize = 0;
          tree_cl.table_len = (uchar *)0x0;
          tree_cl.table_value = (unsigned_short *)0x0;
          frequencies_d.allocsize = 0;
          frequencies_ll.data = (uint *)0x0;
          frequencies_ll.size = 0;
          frequencies_cl.allocsize = 0;
          frequencies_d.data = (uint *)0x0;
          frequencies_d.size = 0;
          bitlen_lld.allocsize = 0;
          frequencies_cl.data = (uint *)0x0;
          frequencies_cl.size = 0;
          bitlen_lld_e.allocsize = 0;
          bitlen_lld.data = (uint *)0x0;
          bitlen_lld.size = 0;
          local_198.allocsize = 0;
          bitlen_lld_e.data = (uint *)0x0;
          bitlen_lld_e.size = 0;
          local_198.data = (uint *)0x0;
          local_198.size = 0;
          local_22c = uVar6;
          if (settings->use_lz77 == 0) {
            uVar6 = uivector_resize(&lz77_encoded,uVar18 - uVar14);
            uVar13 = 0x53;
            puVar9 = lz77_encoded.data;
            if (uVar6 != 0) {
              for (; uVar6 = extraout_EDX_00, uVar14 < uVar18; uVar14 = uVar14 + 1) {
                *puVar9 = (uint)in[uVar14];
                puVar9 = puVar9 + 1;
              }
              goto LAB_0010f6e8;
            }
          }
          else {
            uVar13 = encodeLZ77(&lz77_encoded,&hash,in,uVar14,uVar18,settings->windowsize,
                                settings->minmatch,settings->nicematch,settings->lazymatching);
            uVar6 = extraout_EDX;
            if (uVar13 == 0) {
LAB_0010f6e8:
              uVar6 = uivector_resizev(&frequencies_ll,0x11e,uVar6);
              uVar13 = 0x53;
              if (uVar6 != 0) {
                uVar6 = uivector_resizev(&frequencies_d,0x1e,value);
                puVar9 = frequencies_d.data;
                uVar13 = 0x53;
                if (uVar6 != 0) {
                  for (sVar12 = 0; sVar12 != lz77_encoded.size; sVar12 = sVar12 + 1) {
                    uVar13 = lz77_encoded.data[sVar12];
                    frequencies_ll.data[uVar13] = frequencies_ll.data[uVar13] + 1;
                    if (0x100 < (ulong)uVar13) {
                      frequencies_d.data[lz77_encoded.data[sVar12 + 2]] =
                           frequencies_d.data[lz77_encoded.data[sVar12 + 2]] + 1;
                      sVar12 = sVar12 + 3;
                    }
                  }
                  frequencies_ll.data[0x100] = 1;
                  uVar13 = HuffmanTree_makeFromFrequencies
                                     (&tree_ll,frequencies_ll.data,0x101,frequencies_ll.size,0xf);
                  if ((uVar13 == 0) &&
                     (uVar13 = HuffmanTree_makeFromFrequencies
                                         (&tree_d,puVar9,2,frequencies_d.size,0xf),
                     uVar6 = tree_d.numcodes, puVar9 = tree_ll.lengths, uVar13 == 0)) {
                    uVar3 = tree_ll.numcodes;
                    if (0x11d < tree_ll.numcodes) {
                      uVar3 = 0x11e;
                    }
                    uVar18 = extraout_RDX;
                    for (uVar14 = 0; puVar19 = tree_d.lengths, uVar3 != uVar14; uVar14 = uVar14 + 1)
                    {
                      uivector_push_back(&bitlen_lld,puVar9[uVar14]);
                      uVar18 = extraout_RDX_00;
                    }
                    uVar14 = (ulong)uVar6;
                    if (0x1d < uVar6) {
                      uVar14 = 0x1e;
                    }
                    for (uVar20 = 0; puVar4 = bitlen_lld.data, uVar14 != uVar20; uVar20 = uVar20 + 1
                        ) {
                      uivector_push_back(&bitlen_lld,puVar19[uVar20]);
                      uVar18 = extraout_RDX_01;
                    }
                    uVar20 = bitlen_lld.size & 0xffffffff;
                    local_248 = uVar14;
                    for (uVar17 = 0; uVar17 != uVar20; uVar17 = uVar17 + 1) {
                      uVar13 = puVar4[uVar17];
                      uVar6 = 0;
                      while( true ) {
                        uVar14 = (ulong)uVar6;
                        uVar18 = uVar17 + 1 + uVar14;
                        if ((uVar20 <= uVar18) || (puVar4[uVar18] != uVar13)) break;
                        uVar6 = uVar6 + 1;
                      }
                      if ((uVar13 == 0) && (1 < uVar6)) {
                        uVar13 = uVar6 + 1;
                        if (uVar13 < 0xb) {
                          uivector_push_back(&bitlen_lld_e,0x11);
                          uivector_push_back(&bitlen_lld_e,uVar6 - 2);
                          uVar18 = extraout_RDX_02;
                        }
                        else {
                          if (0x89 < uVar13) {
                            uVar13 = 0x8a;
                          }
                          uivector_push_back(&bitlen_lld_e,0x12);
                          uivector_push_back(&bitlen_lld_e,uVar13 - 0xb);
                          uVar14 = (ulong)(uVar13 - 1);
                          uVar18 = extraout_RDX_06;
                        }
LAB_0010fb33:
                        uVar17 = uVar17 + uVar14;
                      }
                      else {
                        uivector_push_back(&bitlen_lld_e,uVar13);
                        uVar18 = extraout_RDX_03;
                        if (2 < uVar6) {
                          uVar10 = uVar14 / 6;
                          uVar18 = uVar14 % 6;
                          while (bVar21 = uVar10 != 0, uVar10 = uVar10 - 1, bVar21) {
                            uivector_push_back(&bitlen_lld_e,0x10);
                            uivector_push_back(&bitlen_lld_e,3);
                            uVar18 = extraout_RDX_04;
                          }
                          if (uVar6 % 6 < 3) {
                            uVar14 = (ulong)(uVar6 - uVar6 % 6);
                          }
                          else {
                            uivector_push_back(&bitlen_lld_e,0x10);
                            uivector_push_back(&bitlen_lld_e,uVar6 % 6 - 3);
                            uVar18 = extraout_RDX_05;
                          }
                          goto LAB_0010fb33;
                        }
                      }
                    }
                    uVar6 = uivector_resizev(&frequencies_cl,0x13,(uint)uVar18);
                    sVar12 = bitlen_lld_e.size;
                    puVar19 = bitlen_lld_e.data;
                    uVar13 = 0x53;
                    if (uVar6 != 0) {
                      for (sVar11 = 0; sVar11 != bitlen_lld_e.size;
                          sVar11 = (sVar11 - (bitlen_lld_e.data[sVar11] < 0x10)) + 2) {
                        frequencies_cl.data[bitlen_lld_e.data[sVar11]] =
                             frequencies_cl.data[bitlen_lld_e.data[sVar11]] + 1;
                      }
                      uVar13 = HuffmanTree_makeFromFrequencies
                                         (&tree_cl,frequencies_cl.data,frequencies_cl.size,
                                          frequencies_cl.size,7);
                      if (uVar13 == 0) {
                        uVar18 = (ulong)tree_cl._16_8_ >> 0x20;
                        uVar6 = uivector_resize(&local_198,uVar18);
                        puVar4 = tree_cl.lengths;
                        uVar13 = 0x53;
                        if (uVar6 != 0) {
                          for (lVar8 = 0; uVar18 << 2 != lVar8; lVar8 = lVar8 + 4) {
                            *(uint *)((long)local_198.data + lVar8) =
                                 tree_cl.lengths[*(uint *)((long)CLCL_ORDER + lVar8)];
                          }
                          do {
                            sVar11 = local_198.size;
                            puVar1 = local_198.data;
                            if ((local_198.size < 5) || (local_198.data[local_198.size - 1] != 0)) {
                              writeBits(&local_258,local_22c,1);
                              writeBits(&local_258,0,1);
                              writeBits(&local_258,1,1);
                              uVar18 = (ulong)((int)sVar11 - 4) + 3;
                              uVar13 = (int)sVar11 - 3;
                              goto LAB_0010fc9d;
                            }
                            uVar13 = uivector_resize(&local_198,local_198.size - 1);
                          } while (uVar13 != 0);
                          uVar13 = 0x53;
                        }
                      }
                    }
                  }
                }
              }
            }
          }
          goto LAB_0010f8ba;
        }
        uVar13 = 0;
        if (settings->btype == 1) {
          tree_ll.codes = (uint *)0x0;
          tree_ll.lengths = (uint *)0x0;
          tree_ll.table_len = (uchar *)0x0;
          tree_ll.table_value = (unsigned_short *)0x0;
          tree_d.codes = (uint *)0x0;
          tree_d.lengths = (uint *)0x0;
          tree_d.table_len = (uchar *)0x0;
          tree_d.table_value = (unsigned_short *)0x0;
          generateFixedLitLenTree(&tree_ll);
          generateFixedDistanceTree(&tree_d);
          writeBits(&local_258,uVar6,1);
          writeBits(&local_258,1,1);
          writeBits(&local_258,0,1);
          puVar19 = tree_ll.lengths;
          puVar9 = tree_ll.codes;
          if (settings->use_lz77 == 0) {
            for (; uVar14 < uVar18; uVar14 = uVar14 + 1) {
              writeBitsReversed(&local_258,puVar9[in[uVar14]],(ulong)puVar19[in[uVar14]]);
            }
LAB_0010f820:
            writeBitsReversed(&local_258,puVar9[0x100],(ulong)puVar19[0x100]);
            uVar13 = 0;
          }
          else {
            tree_cl.codes = (uint *)0x0;
            tree_cl.lengths = (uint *)0x0;
            tree_cl.maxbitlen = 0;
            tree_cl.numcodes = 0;
            uVar13 = encodeLZ77((uivector *)&tree_cl,&hash,in,uVar14,uVar18,settings->windowsize,
                                settings->minmatch,settings->nicematch,settings->lazymatching);
            if (uVar13 == 0) {
              writeLZ77data(&local_258,(uivector *)&tree_cl,&tree_ll,&tree_d);
              uivector_cleanup(&tree_cl);
              puVar9 = tree_ll.codes;
              puVar19 = tree_ll.lengths;
              goto LAB_0010f820;
            }
            uivector_cleanup(&tree_cl);
          }
          HuffmanTree_cleanup(&tree_ll);
          HuffmanTree_cleanup(&tree_d);
        }
        goto LAB_0010f951;
      }
      free(__ptr);
      free(__ptr_00);
      free(__ptr_01);
      free(__ptr_02);
      free(__ptr_03);
      free(local_238);
      out = local_240;
    }
  }
  else {
    uVar13 = 0x3d;
  }
LAB_0010fe25:
  *out = v.data;
  *outsize = v.size;
  return uVar13;
  while( true ) {
    uVar20 = uVar18 & 0xffffffff;
    uVar18 = uVar18 - 1;
    sVar11 = (size_t)((int)sVar11 - 1);
    if (puVar1[uVar20] != 0) break;
LAB_0010fc9d:
    uVar14 = sVar11 & 0xffffffff;
    uVar13 = uVar13 - 1;
    if (uVar18 == 3) break;
  }
  local_248 = (ulong)((int)local_248 - 1);
  writeBits(&local_258,uVar3 - 0x101,5);
  writeBits(&local_258,(uint)local_248,5);
  writeBits(&local_258,uVar13,4);
  for (uVar18 = 0; puVar5 = tree_cl.codes, uVar14 != uVar18; uVar18 = uVar18 + 1) {
    writeBits(&local_258,puVar1[uVar18],3);
  }
  for (sVar11 = 0; sVar11 != sVar12; sVar11 = sVar11 + 1) {
    writeBitsReversed(&local_258,puVar5[puVar19[sVar11]],(ulong)puVar4[puVar19[sVar11]]);
    puVar1 = puVar19 + sVar11;
    if (*puVar1 - 0x10 < 3) {
      lVar8 = sVar11 + 1;
      sVar11 = sVar11 + 1;
      writeBits(&local_258,puVar19[lVar8],*(size_t *)(&DAT_00125d60 + (ulong)(*puVar1 - 0x10) * 8));
    }
  }
  writeLZ77data(&local_258,&lz77_encoded,&tree_ll,&tree_d);
  uVar18 = (ulong)puVar9[0x100];
  uVar13 = 0x40;
  if (uVar18 != 0) {
    writeBitsReversed(&local_258,tree_ll.codes[0x100],uVar18);
    uVar13 = 0;
  }
LAB_0010f8ba:
  uivector_cleanup(&lz77_encoded);
  HuffmanTree_cleanup(&tree_ll);
  HuffmanTree_cleanup(&tree_d);
  HuffmanTree_cleanup(&tree_cl);
  uivector_cleanup(&frequencies_ll);
  uivector_cleanup(&frequencies_d);
  uivector_cleanup(&frequencies_cl);
  uivector_cleanup(&bitlen_lld_e);
  uivector_cleanup(&bitlen_lld);
  uivector_cleanup(&local_198);
LAB_0010f951:
  uVar16 = uVar16 + 1;
  goto LAB_0010f4a3;
}

Assistant:

unsigned lodepng_deflate(unsigned char** out, size_t* outsize,
                         const unsigned char* in, size_t insize,
                         const LodePNGCompressSettings* settings) {
  unsigned error;
  ucvector v;
  ucvector_init_buffer(&v, *out, *outsize);
  error = lodepng_deflatev(&v, in, insize, settings);
  *out = v.data;
  *outsize = v.size;
  return error;
}